

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameParseCleanup(Parse *pParse)

{
  RenameToken *in_RDI;
  Index *pIdx;
  sqlite3 *db;
  Table *pTable;
  Index *p;
  sqlite3 *db_00;
  
  db_00 = (sqlite3 *)in_RDI->p;
  pTable = (Table *)&DAT_aaaaaaaaaaaaaaaa;
  if (*(long *)&(in_RDI->t).n != 0) {
    sqlite3VdbeFinalize((Vdbe *)db_00);
  }
  sqlite3DeleteTable(db_00,pTable);
  while (p = (Index *)in_RDI[0xb].t.z, p != (Index *)0x0) {
    in_RDI[0xb].t.z = (char *)p->pNext;
    sqlite3FreeIndex(db_00,p);
  }
  sqlite3DeleteTrigger(db_00,(Trigger *)0x0);
  sqlite3DbFree(db_00,p);
  renameTokenFree((sqlite3 *)pIdx,in_RDI);
  sqlite3ParseObjectReset((Parse *)pIdx);
  return;
}

Assistant:

static void renameParseCleanup(Parse *pParse){
  sqlite3 *db = pParse->db;
  Index *pIdx;
  if( pParse->pVdbe ){
    sqlite3VdbeFinalize(pParse->pVdbe);
  }
  sqlite3DeleteTable(db, pParse->pNewTable);
  while( (pIdx = pParse->pNewIndex)!=0 ){
    pParse->pNewIndex = pIdx->pNext;
    sqlite3FreeIndex(db, pIdx);
  }
  sqlite3DeleteTrigger(db, pParse->pNewTrigger);
  sqlite3DbFree(db, pParse->zErrMsg);
  renameTokenFree(db, pParse->pRename);
  sqlite3ParseObjectReset(pParse);
}